

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O2

void strsort(uchar **strings,Lcp *lcps,int lo,int hi)

{
  Lcp LVar1;
  uchar *p;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int local_40;
  
  if (hi <= lo) {
    return;
  }
  p = strings[lo];
  iVar7 = lo + 1;
  iVar5 = hi;
  local_40 = lo;
LAB_001d32da:
  do {
    lVar6 = (long)iVar7 << 2;
    while( true ) {
      if (iVar5 < iVar7) {
        lcpsort<true>(strings,lcps,lo,local_40 + -1);
        lcpsort<false>(strings,lcps,iVar5 + 1,hi);
        return;
      }
      iVar3 = lcpstrcmp(p,*(uchar **)((long)strings + lVar6 * 2),(Lcp *)((long)lcps + lVar6));
      if (iVar3 < 0) {
        iVar7 = iVar7 + 1;
        lVar4 = (long)local_40;
        local_40 = local_40 + 1;
        puVar2 = strings[lVar4];
        strings[lVar4] = *(uchar **)((long)strings + lVar6 * 2);
        *(uchar **)((long)strings + lVar6 * 2) = puVar2;
        LVar1 = lcps[lVar4];
        lcps[lVar4] = *(Lcp *)((long)lcps + lVar6);
        *(Lcp *)((long)lcps + lVar6) = LVar1;
        goto LAB_001d32da;
      }
      if (iVar3 != 0) break;
      iVar7 = iVar7 + 1;
      lVar6 = lVar6 + 4;
    }
    puVar2 = *(uchar **)((long)strings + lVar6 * 2);
    *(uchar **)((long)strings + lVar6 * 2) = strings[iVar5];
    strings[iVar5] = puVar2;
    LVar1 = *(Lcp *)((long)lcps + lVar6);
    *(Lcp *)((long)lcps + lVar6) = lcps[iVar5];
    lcps[iVar5] = LVar1;
    iVar5 = iVar5 + -1;
  } while( true );
}

Assistant:

void strsort(unsigned char * strings[], Lcp lcps[], int lo, int hi )
{
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  unsigned char  *  pivotStr = strings[lo];
  for( int i = lo + 1; i <= gt; )
    {
      int cmpr = lcpstrcmp( pivotStr, strings[i], lcps[i] );
      if      (cmpr < 0) exch( strings, lcps, lt++, i++);
      else if (cmpr > 0) exch( strings, lcps, i, gt--);
      else            i++;
    }

  lcpsort<true> ( strings, lcps, lo, lt-1 );
  lcpsort<false>( strings, lcps, gt+1, hi );  
}